

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.hh
# Opt level: O1

void __thiscall tinyusdz::tydra::SkelHierarchy::~SkelHierarchy(SkelHierarchy *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::~vector
            (&(this->root_node).children);
  pcVar1 = (this->root_node).joint_name._M_dataplus._M_p;
  paVar2 = &(this->root_node).joint_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->root_node).joint_path._M_dataplus._M_p;
  paVar2 = &(this->root_node).joint_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->display_name)._M_dataplus._M_p;
  paVar2 = &(this->display_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->abs_path)._M_dataplus._M_p;
  paVar2 = &(this->abs_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->prim_name)._M_dataplus._M_p;
  paVar2 = &(this->prim_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

SkelHierarchy() = default;